

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar3;
  undefined4 *puVar4;
  undefined6 in_register_0000003a;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,(uint)data->PropertyIdIndex);
  pPVar3 = ScriptContext::GetPropertyName(this,propertyId);
  switch((int)CONCAT62(in_register_0000003a,op)) {
  case 0x121:
    Output::Print(L" R%d = R%d(this=R%d).%s #%d",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->Value2,pPVar3 + 1,(ulong)data->PropertyIdIndex);
    return;
  case 0x122:
    Output::Print(L" R%d = R%d(this=R%d).%s #%d",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->Value2,pPVar3 + 1,(ulong)data->PropertyIdIndex);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x315,"(false)","Unknown OpCode for OpLayoutElementC2");
    if (bVar2) {
      *puVar4 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case 0x127:
  case 0x129:
    Output::Print(L" R%d.%s(this=R%d) = R%d #%d",(ulong)data->Instance,pPVar3 + 1,
                  (ulong)data->Value2,(ulong)data->Value,(ulong)data->PropertyIdIndex);
    return;
  case 0x128:
  case 0x12a:
    Output::Print(L" R%d.%s(this=R%d) = R%d #%d",(ulong)data->Instance,pPVar3 + 1,
                  (ulong)data->Value2,(ulong)data->Value,(ulong)data->PropertyIdIndex);
  }
  DumpProfileId((uint)data->PropertyIdIndex);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementC2(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::LdSuperFld:
            {
                Output::Print(_u(" R%d = R%d(this=R%d).%s #%d"), data->Value, data->Instance, data->Value2,
                        pPropertyName->GetBuffer(), data->PropertyIdIndex);
                break;
            }
            case OpCode::ProfiledLdSuperFld:
            {
                Output::Print(_u(" R%d = R%d(this=R%d).%s #%d"), data->Value, data->Instance, data->Value2,
                        pPropertyName->GetBuffer(), data->PropertyIdIndex);
                DumpProfileId(data->PropertyIdIndex);
                break;
            }
            case OpCode::StSuperFld:
            case OpCode::StSuperFldStrict:
            {
                Output::Print(_u(" R%d.%s(this=R%d) = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                    data->Value2, data->Value, data->PropertyIdIndex);
                break;
            }
            case OpCode::ProfiledStSuperFld:
            case OpCode::ProfiledStSuperFldStrict:
            {
                Output::Print(_u(" R%d.%s(this=R%d) = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                    data->Value2, data->Value, data->PropertyIdIndex);
                DumpProfileId(data->PropertyIdIndex);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementC2");
                break;
            }
        }
    }